

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::b_formatter<spdlog::details::scoped_padder>::format
          (b_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t *this_00;
  const_reference ppcVar1;
  size_t wrapped_size;
  memory_buf_t *dest_00;
  string_view_t view;
  undefined1 local_60 [8];
  scoped_padder p;
  string_view_t field_value;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  b_formatter<spdlog::details::scoped_padder> *this_local;
  
  ppcVar1 = std::array<const_char_*,_12UL>::operator[]
                      ((array<const_char_*,_12UL> *)months,(long)tm_time->tm_mon);
  this_00 = &p.spaces_.size_;
  fmt::v7::basic_string_view<char>::basic_string_view((basic_string_view<char> *)this_00,*ppcVar1);
  wrapped_size = fmt::v7::basic_string_view<char>::size((basic_string_view<char> *)this_00);
  dest_00 = dest;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_60,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  view.size_ = (size_t)dest;
  view.data_ = field_value.data_;
  fmt_helper::append_string_view((fmt_helper *)p.spaces_.size_,view,dest_00);
  scoped_padder::~scoped_padder((scoped_padder *)local_60);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        string_view_t field_value{months[static_cast<size_t>(tm_time.tm_mon)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }